

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

uint PrintStackFrame(int address,char *current,uint bufSize,bool withVariables)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ExternFuncInfo *pEVar6;
  byte *pbVar7;
  ExternTypeInfo *pEVar8;
  ExternLocalInfo *pEVar9;
  ExternVarInfo *pEVar10;
  int iVar11;
  undefined7 in_register_00000009;
  int *piVar12;
  char *pcVar13;
  long lVar14;
  uint *puVar15;
  uint i;
  uint uVar16;
  ulong uVar17;
  ExternSourceInfo *pEVar18;
  byte *pbVar19;
  byte *pbVar20;
  char *pcVar21;
  char *pcVar22;
  byte *pbVar23;
  ulong uVar24;
  uint exLocalsSize;
  char *local_68;
  undefined4 local_5c;
  uint exInfoSize;
  uint exModulesSize;
  long local_50;
  ExternModuleInfo *local_48;
  ExternSourceInfo *local_40;
  uint exTypesSize;
  uint exFunctionsSize;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,withVariables);
  exFunctionsSize = 0;
  pEVar6 = nullcDebugFunctionInfo(&exFunctionsSize);
  local_68 = nullcDebugSymbols((uint *)0x0);
  exModulesSize = 0;
  local_48 = nullcDebugModuleInfo(&exModulesSize);
  exInfoSize = 0;
  local_40 = nullcDebugSourceInfo(&exInfoSize);
  pbVar7 = (byte *)nullcDebugSource();
  piVar12 = &pEVar6->regVmCodeSize;
  uVar17 = 0xffffffffffffffff;
  for (uVar24 = 0; exFunctionsSize != uVar24; uVar24 = uVar24 + 1) {
    if ((piVar12[-1] <= address) && (uVar17 = uVar17 & 0xffffffff, address < piVar12[-1] + *piVar12)
       ) {
      uVar17 = uVar24 & 0xffffffff;
    }
    piVar12 = piVar12 + 0x25;
  }
  iVar5 = (int)uVar17;
  local_50 = (long)iVar5;
  if (iVar5 == -1) {
    pcVar22 = "global scope";
    if (address == -1) {
      pcVar22 = "external";
    }
    iVar3 = NULLC::SafeSprintf(current,(ulong)bufSize,"%s",pcVar22);
  }
  else {
    iVar3 = NULLC::SafeSprintf(current,(ulong)bufSize,"%s",local_68 + pEVar6[local_50].offsetToName)
    ;
  }
  pcVar22 = current + iVar3;
  if (address != -1) {
    uVar17 = (ulong)(exInfoSize - 1);
    lVar14 = 1;
    pEVar18 = local_40;
    do {
      pEVar18 = pEVar18 + 1;
      if (uVar17 + lVar14 == 1) goto LAB_0021fd9f;
      lVar14 = lVar14 + -1;
    } while (pEVar18->instruction <= address - 1U);
    uVar17 = -lVar14;
LAB_0021fd9f:
    uVar17 = (ulong)local_40[uVar17].sourceOffset;
    do {
      uVar24 = uVar17;
      pbVar23 = pbVar7;
      if (uVar24 == 0) goto LAB_0021fdd2;
      uVar17 = uVar24 - 1;
    } while (pbVar7[uVar24 - 1] != 10);
    pbVar23 = pbVar7 + uVar24;
LAB_0021fdd2:
    for (; (bVar1 = *pbVar23, bVar1 == 9 || (bVar1 == 0x20)); pbVar23 = pbVar23 + 1) {
    }
    puVar15 = &local_48->sourceSize;
    uVar17 = 0xffffffffffffffff;
    uVar24 = 0;
    pbVar19 = (byte *)0x0;
    while ((exModulesSize != uVar24 &&
           (((pbVar20 = pbVar7 + puVar15[-1], pbVar20 <= pbVar23 || (pbVar23 < pbVar19)) ||
            (pbVar20 <= pbVar19))))) {
      pbVar19 = pbVar20 + *puVar15;
      uVar2 = uVar17;
      if (pbVar23 < pbVar19) {
        uVar2 = uVar24;
      }
      if (pbVar20 <= pbVar23) {
        uVar17 = uVar2;
      }
      uVar17 = uVar17 & 0xffffffff;
      uVar24 = uVar24 + 1;
      puVar15 = puVar15 + 7;
    }
    if ((int)uVar17 != -1) {
      pbVar19 = pbVar7 + local_48[uVar17 & 0xffffffff].sourceOffset;
    }
    iVar11 = 0;
    for (; pbVar19 < pbVar23; pbVar19 = pbVar19 + 1) {
      iVar11 = iVar11 + (uint)(*pbVar19 == 10);
    }
    lVar14 = 0;
    while ((0xd < bVar1 || ((0x2401U >> (bVar1 & 0x1f) & 1) == 0))) {
      bVar1 = pbVar23[lVar14 + 1];
      lVar14 = lVar14 + 1;
    }
    iVar3 = NULLC::SafeSprintf(pcVar22,(ulong)(bufSize - iVar3)," (line %d: at %.*s)\r\n",
                               (ulong)(iVar11 + 1),lVar14,pbVar23);
    pcVar22 = pcVar22 + iVar3;
  }
  iVar3 = (int)current;
  if ((char)local_5c != '\0') {
    exTypesSize = 0;
    pEVar8 = nullcDebugTypeInfo(&exTypesSize);
    if (iVar5 == -1) {
      exLocalsSize = 0;
      pEVar10 = nullcDebugVariableInfo(&exLocalsSize);
      puVar15 = &pEVar10->offset;
      for (uVar17 = 0; uVar17 < exLocalsSize; uVar17 = uVar17 + 1) {
        iVar5 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar3 - (int)pcVar22) + bufSize),
                                   " %s %d: %s %s (at %d size %d)\r\n","global",uVar17 & 0xffffffff,
                                   local_68 + pEVar8[puVar15[-1]].offsetToName,
                                   local_68 + ((ExternVarInfo *)(puVar15 + -3))->offsetToName,
                                   (ulong)*puVar15,(ulong)pEVar8[puVar15[-1]].size);
        pcVar22 = pcVar22 + iVar5;
        puVar15 = puVar15 + 4;
      }
    }
    else {
      exLocalsSize = 0;
      pEVar9 = nullcDebugLocalInfo(&exLocalsSize);
      lVar14 = local_50;
      for (uVar16 = 0; uVar16 < pEVar6[lVar14].externCount + pEVar6[lVar14].localCount;
          uVar16 = uVar16 + 1) {
        uVar4 = pEVar6[lVar14].offsetToFirstLocal + uVar16;
        bVar1 = pEVar9[uVar4].paramType;
        pcVar13 = "local";
        if (bVar1 == 2) {
          pcVar13 = "extern";
        }
        if (bVar1 == 0) {
          pcVar13 = "param";
        }
        pcVar21 = "base";
        if ((1 < bVar1) && (pcVar21 = "local", -1 < (int)pEVar9[uVar4].closeListID)) {
          pcVar21 = "closure";
        }
        iVar5 = NULLC::SafeSprintf(pcVar22,(ulong)((iVar3 - (int)pcVar22) + bufSize),
                                   " %s %d: %s %s (at %s+%d size %d)\r\n",pcVar13,(ulong)uVar16,
                                   local_68 + pEVar8[pEVar9[uVar4].type].offsetToName,
                                   local_68 + pEVar9[uVar4].offsetToName,pcVar21,
                                   (ulong)pEVar9[uVar4].offset,
                                   (ulong)pEVar8[pEVar9[uVar4].type].size);
        pcVar22 = pcVar22 + iVar5;
      }
    }
  }
  return (int)pcVar22 - iVar3;
}

Assistant:

unsigned int PrintStackFrame(int address, char* current, unsigned int bufSize, bool withVariables)
{
	const char *start = current;

	unsigned exFunctionsSize = 0;
	ExternFuncInfo *exFunctions = nullcDebugFunctionInfo(&exFunctionsSize);

	char *exSymbols = nullcDebugSymbols(NULL);

	unsigned exModulesSize = 0;
	ExternModuleInfo *exModules = nullcDebugModuleInfo(&exModulesSize);

	unsigned exInfoSize = 0;
	ExternSourceInfo *exInfo = nullcDebugSourceInfo(&exInfoSize);

	char *source = nullcDebugSource();

	int funcID = -1;
	for(unsigned int i = 0; i < exFunctionsSize; i++)
	{
		if(address >= exFunctions[i].regVmAddress && address < (exFunctions[i].regVmAddress + exFunctions[i].regVmCodeSize))
			funcID = i;
	}

	if(funcID != -1)
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", &exSymbols[exFunctions[funcID].offsetToName]);
	else
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", address == -1 ? "external" : "global scope");

	if(address != -1)
	{
		unsigned int infoID = 0;
		unsigned int i = address - 1;
		while((infoID < exInfoSize - 1) && (i >= exInfo[infoID + 1].instruction))
			infoID++;
		const char *codeStart = source + exInfo[infoID].sourceOffset;

		// Find beginning of the line
		while(codeStart != source && *(codeStart-1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;
		const char *codeEnd = codeStart;

		// Find corresponding module
		unsigned moduleID = ~0u;
		const char *prevEnd = NULL;
		for(unsigned l = 0; l < exModulesSize; l++)
		{
			// special check for main module
			if(source + exModules[l].sourceOffset > prevEnd && codeStart >= prevEnd && codeStart < source + exModules[l].sourceOffset)
				break;
			if(codeStart >= source + exModules[l].sourceOffset && codeStart < source + exModules[l].sourceOffset + exModules[l].sourceSize)
				moduleID = l;
			prevEnd = source + exModules[l].sourceOffset + exModules[l].sourceSize;
		}
		const char *moduleStart = NULL;
		if(moduleID != ~0u)
			moduleStart = source + exModules[moduleID].sourceOffset;
		else
			moduleStart = prevEnd;

		// Find line number
		unsigned line = 0;
		while(moduleStart < codeStart)
		{
			if(*moduleStart++ == '\n')
				line++;
		}

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = (int)(codeEnd - codeStart);
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), " (line %d: at %.*s)\r\n", line + 1, codeLength, codeStart);
	}

	if(withVariables)
	{
		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		if(funcID != -1)
		{
			unsigned exLocalsSize = 0;
			ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

			for(unsigned int i = 0; i < exFunctions[funcID].localCount + exFunctions[funcID].externCount; i++)
			{
				ExternLocalInfo &lInfo = exLocals[exFunctions[funcID].offsetToFirstLocal + i];
				const char *typeName = &exSymbols[exTypes[lInfo.type].offsetToName];
				const char *localName = &exSymbols[lInfo.offsetToName];
				const char *localType = lInfo.paramType == ExternLocalInfo::PARAMETER ? "param" : (lInfo.paramType == ExternLocalInfo::EXTERNAL ? "extern" : "local");
				const char *offsetType = (lInfo.paramType == ExternLocalInfo::PARAMETER || lInfo.paramType == ExternLocalInfo::LOCAL) ? "base" : (lInfo.closeListID & 0x80000000 ? "local" : "closure");
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %s+%d size %d)\r\n",	localType, i, typeName, localName, offsetType, lInfo.offset, exTypes[lInfo.type].size);
			}
		}
		else
		{
			unsigned exVariablesSize = 0;
			ExternVarInfo *exVariables = nullcDebugVariableInfo(&exVariablesSize);

			for(unsigned i = 0; i < exVariablesSize; i++)
			{
				ExternVarInfo &vInfo = exVariables[i];

				const char *typeName = &exSymbols[exTypes[vInfo.type].offsetToName];
				const char *localName = &exSymbols[vInfo.offsetToName];
				const char *localType = "global";
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %d size %d)\r\n", localType, i, typeName, localName, vInfo.offset, exTypes[vInfo.type].size);
			}
		}
	}

	return (unsigned int)(current - start);
}